

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  LogMessage *other;
  ulong uVar6;
  uint8 *puVar7;
  uint uVar8;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar8 = field_number << 3;
  pbVar4 = output->cur_;
  if ((output->impl_).end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
  }
  output->cur_ = pbVar4;
  if (uVar8 < 0x80) {
    *pbVar4 = (byte)uVar8 | 2;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar8 | 0x82;
    if (uVar8 < 0x4000) {
      pbVar4[1] = (byte)(uVar8 >> 7);
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      uVar8 = uVar8 >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar8 | 0x80;
        uVar3 = uVar8 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar3;
      } while (bVar2);
      *pbVar5 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar4;
  if ((value->_M_string_length & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/wire_format_lite.cc",0x1eb);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (value.size()) <= (kint32max): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  uVar1 = value->_M_string_length;
  pbVar4 = output->cur_;
  if ((output->impl_).end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
  }
  output->cur_ = pbVar4;
  if ((uint)uVar1 < 0x80) {
    *pbVar4 = (byte)uVar1;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)uVar1 | 0x80;
    uVar6 = uVar1 >> 7 & 0x1ffffff;
    if ((uint)uVar1 < 0x4000) {
      pbVar4[1] = (byte)uVar6;
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      do {
        pbVar5 = pbVar4;
        uVar8 = (uint)uVar6;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar3 = uVar8 >> 7;
        uVar6 = (ulong)uVar3;
        pbVar4 = pbVar5 + 1;
      } while (0x3fff < uVar8);
      *pbVar5 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar4;
  puVar7 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (&output->impl_,(value->_M_dataplus)._M_p,(int)value->_M_string_length,pbVar4);
  output->cur_ = puVar7;
  return;
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}